

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_align<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  basic_string_view<char> fill;
  char cVar1;
  int iVar2;
  type count;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char c;
  char *p;
  type align;
  char *in_stack_ffffffffffffff98;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  char *pcVar3;
  basic_string_view<char> local_48;
  char local_31;
  char *local_30;
  int local_28;
  bool local_21;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *local_20;
  char *local_18;
  char *local_10;
  
  local_21 = in_RDI != in_RSI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  ignore_unused<bool,char[1]>(&local_21,(char (*) [1])0x1be1d2);
  local_28 = 0;
  pcVar3 = local_10;
  iVar2 = code_point_length<char>(local_10);
  local_30 = pcVar3 + iVar2;
  if (local_18 <= local_30) {
    local_30 = local_10;
  }
  while( true ) {
    cVar1 = to_ascii<char,_0>(*local_30);
    iVar2 = (int)cVar1;
    if (iVar2 == 0x3c) {
      local_28 = 1;
    }
    else if (iVar2 == 0x3e) {
      local_28 = 2;
    }
    else if (iVar2 == 0x5e) {
      local_28 = 3;
    }
    if (local_28 != 0) break;
    if (local_30 == local_10) {
      return local_10;
    }
    local_30 = local_10;
  }
  if (local_30 != local_10) {
    local_31 = *local_10;
    if (local_31 == '{') {
      specs_handler<char>::on_error
                (&in_stack_ffffffffffffffa0->super_specs_handler<char>,in_stack_ffffffffffffff98);
      return local_10;
    }
    count = to_unsigned<long>((long)local_20);
    basic_string_view<char>::basic_string_view(&local_48,local_10,count);
    fill.data_._4_4_ = iVar2;
    fill.data_._0_4_ = in_stack_ffffffffffffffa8;
    fill.size_ = (size_t)pcVar3;
    specs_setter<char>::on_fill((specs_setter<char> *)local_20,fill);
    in_stack_ffffffffffffff98 = local_10;
    in_stack_ffffffffffffffa0 = local_20;
    local_10 = local_30;
  }
  local_10 = local_10 + 1;
  specs_checker<fmt::v8::detail::specs_handler<char>_>::on_align
            (in_stack_ffffffffffffffa0,(align_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  return local_10;
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}